

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::EmitterBeam::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EmitterBeam *this)

{
  pointer pTVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KUINT16 Tabs_01;
  KUINT16 Tabs_02;
  KINT32 Value;
  KINT32 Value_00;
  pointer pTVar3;
  KStringStream ss;
  KString local_2b8;
  KString local_298;
  KString local_278;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = std::operator<<(local_1a8,"Emitter Beam:\n\t");
  poVar2 = std::operator<<(poVar2,"\n\tBeam Data Length (32bits):        ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8BeamDataLength);
  poVar2 = std::operator<<(poVar2,"\n\tEmitter Beam ID Number:           ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8EmitterBeamIDNumber);
  poVar2 = std::operator<<(poVar2,"\n\tBeam Parameter Index:             ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16BeamParamIndex);
  FundamentalParameterData::GetAsString_abi_cxx11_(&local_2b8,&this->m_FundamentalParameterData);
  UTILS::IndentString(&local_298,&local_2b8,Tabs,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_298);
  poVar2 = std::operator<<(poVar2,"\tBeam Function:                    ");
  ENUMS::GetEnumAsStringEmitterFunction_abi_cxx11_
            (&local_1d8,(ENUMS *)(ulong)this->m_ui8BeamFunction,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2,"\n\tNumber Of Targets Tracked/Jammed: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumTargetInTrackJamField);
  poVar2 = std::operator<<(poVar2,"\n\tHigh Density Track/Jam:           ");
  ENUMS::GetEnumAsStringHighDensityTrackJam_abi_cxx11_
            (&local_1f8,(ENUMS *)(ulong)this->m_ui8HighDensityTrackJam,Value_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
  BeamStatus::GetAsString_abi_cxx11_(&local_238,&this->m_BeamStatus);
  UTILS::IndentString(&local_218,&local_238,Tabs_00,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_218);
  JammingTechnique::GetAsString_abi_cxx11_(&local_278,&this->m_JammingTechnique);
  UTILS::IndentString(&local_258,&local_278,Tabs_01,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_258);
  std::operator<<(poVar2,"\n\tTracked/Jammed Targets:\n");
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  pTVar1 = (this->m_vTrackJamTargets).
           super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pTVar3 = (this->m_vTrackJamTargets).
                super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
                ._M_impl.super__Vector_impl_data._M_start; pTVar3 != pTVar1; pTVar3 = pTVar3 + 1) {
    poVar2 = std::operator<<(local_1a8,"Target:\n");
    (*(pTVar3->super_EntityIdentifier).super_SimulationIdentifier.super_DataTypeBase.
      _vptr_DataTypeBase[2])(&local_2b8,pTVar3);
    UTILS::IndentString(&local_298,&local_2b8,Tabs_02,in_CL);
    std::operator<<(poVar2,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

KString EmitterBeam::GetAsString() const
{
    KStringStream ss;

    ss << "Emitter Beam:\n\t"
       << "\n\tBeam Data Length (32bits):        " << ( KUINT16 )m_ui8BeamDataLength
       << "\n\tEmitter Beam ID Number:           " << ( KUINT16 )m_ui8EmitterBeamIDNumber
       << "\n\tBeam Parameter Index:             " << m_ui16BeamParamIndex
       << IndentString( m_FundamentalParameterData.GetAsString(), 1 )
       << "\tBeam Function:                    "   << GetEnumAsStringEmitterFunction( m_ui8BeamFunction )
       << "\n\tNumber Of Targets Tracked/Jammed: " << ( KUINT16 )m_ui8NumTargetInTrackJamField
       << "\n\tHigh Density Track/Jam:           " <<  GetEnumAsStringHighDensityTrackJam( m_ui8HighDensityTrackJam )
#if DIS_VERSION < 7
       << "\n\tJamming Mode Sequence:            " << m_ui32JammingModeSequence
#elif DIS_VERSION > 6
       << IndentString( m_BeamStatus.GetAsString(), 1 )
       << IndentString( m_JammingTechnique.GetAsString(), 1 )
#endif
       << "\n\tTracked/Jammed Targets:\n";

    vector<TrackJamTargetIdentifier>::const_iterator citr = m_vTrackJamTargets.begin();
    vector<TrackJamTargetIdentifier>::const_iterator citrEnd = m_vTrackJamTargets.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ss << "Target:\n"
           << IndentString( citr->GetAsString(), 1 );
    }

    return ss.str();
}